

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BloomFilter.hpp
# Opt level: O2

bool __thiscall
supermap::BloomFilter<supermap::Key<128UL>_>::mightContain
          (BloomFilter<supermap::Key<128UL>_> *this,Key<128UL> *value)

{
  XXH64_hash_t *pXVar1;
  XXH64_hash_t *pXVar2;
  const_reference cVar3;
  uint64_t __n;
  IllegalStateException *this_00;
  XXH64_hash_t *pXVar4;
  unsigned_long *seed;
  allocator<char> local_51;
  string data;
  
  if (((this->elements_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
       ._M_start.super__Bit_iterator_base._M_p ==
       (this->elements_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
       ._M_finish.super__Bit_iterator_base._M_p) &&
     ((this->elements_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset == 0)) {
    this_00 = (IllegalStateException *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&data,"Filter size was not reserved or was set to zero",&local_51);
    supermap::IllegalStateException::IllegalStateException(this_00,(string *)&data);
    __cxa_throw(this_00,&IllegalStateException::typeinfo,std::logic_error::~logic_error);
  }
  BloomFilter<supermap::Key<128ul>>::serialize_abi_cxx11_(&data,this,value);
  pXVar1 = (this->seeds_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pXVar2 = (this->seeds_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  do {
    pXVar4 = pXVar2;
    if (pXVar4 == pXVar1) break;
    __n = getHashWithSeed(this,&data,*pXVar4);
    cVar3 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->elements_,__n);
    pXVar2 = pXVar4 + 1;
  } while (cVar3);
  std::__cxx11::string::~string((string *)&data);
  return pXVar4 == pXVar1;
}

Assistant:

bool mightContain(const T &value) const override {
        if (elements_.empty()) {
            throw supermap::IllegalStateException("Filter size was not reserved or was set to zero");
        }
        std::string data = serialize(value);
        for (auto &seed : seeds_) {
            std::uint64_t index = getHashWithSeed(data, seed);
            if (!elements_[index]) {
                return false;
            }
        }
        return true;
    }